

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

bool __thiscall String::toBool(String *this)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool local_61;
  char *local_60;
  char *p;
  String local_40;
  String *local_18;
  String *this_local;
  
  bVar2 = false;
  local_61 = true;
  local_18 = this;
  if (this->data->len != 0) {
    String<6ul>(&local_40,(char (*) [6])"false");
    bVar2 = true;
    bVar3 = equalsIgnoreCase(this,&local_40);
    local_61 = true;
    if (!bVar3) {
      local_61 = operator==(this,(char (*) [2])0x12b79f);
    }
  }
  if (bVar2) {
    ~String(&local_40);
  }
  if (local_61 == false) {
    for (local_60 = operator_cast_to_char_(this); *local_60 == '0'; local_60 = local_60 + 1) {
    }
    if (*local_60 == '.') {
      do {
        pcVar1 = local_60;
        local_60 = pcVar1 + 1;
      } while (*local_60 == '0');
      if ((*local_60 == '\0') && ((*pcVar1 == '0' || (*this->data->str == '0')))) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool toBool() const
  {
    if(data->len == 0 || equalsIgnoreCase("false") || *this == "0")
      return false;
    const char* p = *this;
    for(; *p == '0'; ++p);
    if(*p == '.')
    {
      for(++p; *p == '0'; ++p);
      if(!*p && (p[-1] == '0' || *data->str == '0'))
        return false;
    }
    return true;
  }